

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_util.c
# Opt level: O1

int kvtree_util_get_double(kvtree *hash,char *key,double *val)

{
  int iVar1;
  int iVar2;
  char *str;
  double val_tmp;
  double local_10;
  
  str = kvtree_get_val(hash,key);
  if (str == (char *)0x0) {
    iVar2 = 1;
  }
  else {
    iVar1 = kvtree_atod(str,&local_10);
    iVar2 = 1;
    if (iVar1 == 0) {
      *val = local_10;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int kvtree_util_get_double(const kvtree* hash, const char* key, double* val)
{
  int rc = KVTREE_FAILURE;

  /* check whether this key is even set */
  char* val_str = kvtree_get_val(hash, key);
  if (val_str != NULL) {
    /* convert the key string */
    double val_tmp;
    if (kvtree_atod(val_str, &val_tmp) == KVTREE_SUCCESS) {
      *val = val_tmp;
      rc = KVTREE_SUCCESS;
    }
  }

  return rc;
}